

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.hpp
# Opt level: O1

void __thiscall jsonip::semantic_state::pre(semantic_state *this)

{
  pointer ppVar1;
  pointer ppVar2;
  ulong uVar3;
  pair<jsonip::holder,_const_jsonip::helper_*> local_28;
  
  ppVar1 = (this->state).
           super__Vector_base<std::pair<jsonip::holder,_const_jsonip::helper_*>,_std::allocator<std::pair<jsonip::holder,_const_jsonip::helper_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (this->state).
           super__Vector_base<std::pair<jsonip::holder,_const_jsonip::helper_*>,_std::allocator<std::pair<jsonip::holder,_const_jsonip::helper_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar3 = (long)ppVar2 - (long)ppVar1;
  if (uVar3 == 0) {
    __assert_fail("state.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/catedrasaes-umu[P]jsonip/jsonip/parse.hpp"
                  ,0x12,"void jsonip::semantic_state::pre()");
  }
  if (ppVar2[-1].first.t == (void *)0x0) {
    if (uVar3 < 0x11) {
      __assert_fail("state.size() > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/catedrasaes-umu[P]jsonip/jsonip/parse.hpp"
                    ,0x16,"void jsonip::semantic_state::pre()");
    }
    (**(code **)(**(long **)((long)ppVar1 + uVar3 + -0x18) + 0x48))(&local_28);
    std::
    vector<std::pair<jsonip::holder,jsonip::helper_const*>,std::allocator<std::pair<jsonip::holder,jsonip::helper_const*>>>
    ::emplace_back<std::pair<jsonip::holder,jsonip::helper_const*>>
              ((vector<std::pair<jsonip::holder,jsonip::helper_const*>,std::allocator<std::pair<jsonip::holder,jsonip::helper_const*>>>
                *)this,&local_28);
  }
  return;
}

Assistant:

void pre()
        {
            assert(state.size());
            if (state.back().first.valid())
                return;

            assert(state.size() > 1);
            state_t& array_state = state[state.size() - 2];
            state.push_back(array_state.second->new_child(array_state.first));
        }